

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetSourceFilePropertyCommand::InitialPass
          (cmGetSourceFilePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  char *pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  cmSourceFile *this_00;
  char *pcVar5;
  long lVar6;
  allocator local_71;
  string local_70;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 != 0x60) {
    std::__cxx11::string::string
              ((string *)&local_70,"called with incorrect number of arguments",
               (allocator *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    goto LAB_0031c209;
  }
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  pcVar5 = pbVar1[1]._M_dataplus._M_p;
  pcVar3 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_50);
  this_00 = cmMakefile::GetSource(pcVar3,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (this_00 == (cmSourceFile *)0x0) {
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"LOCATION");
    if (bVar4) {
      pcVar3 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_50);
      this_00 = cmMakefile::CreateSource(pcVar3,&local_70,false);
      std::__cxx11::string::~string((string *)&local_70);
      if (this_00 != (cmSourceFile *)0x0) goto LAB_0031c0ba;
    }
  }
  else {
LAB_0031c0ba:
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"LANGUAGE");
    if (bVar4) {
      pcVar3 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_70,pcVar2,&local_71);
      cmSourceFile::GetLanguage_abi_cxx11_(&local_50,this_00);
      cmMakefile::AddDefinition(pcVar3,&local_70,local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_0031c209;
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pbVar1[2]._M_string_length != 0) &&
       (pcVar5 = cmSourceFile::GetPropertyForUser(this_00,pbVar1 + 2), pcVar5 != (char *)0x0)) {
      pcVar3 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&local_50);
      cmMakefile::AddDefinition(pcVar3,&local_70,pcVar5);
      goto LAB_0031c209;
    }
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&local_50);
  cmMakefile::AddDefinition(pcVar3,&local_70,"NOTFOUND");
LAB_0031c209:
  std::__cxx11::string::~string((string *)&local_70);
  return lVar6 == 0x60;
}

Assistant:

bool cmGetSourceFilePropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  const char* var = args[0].c_str();
  const char* file = args[1].c_str();
  cmSourceFile* sf = this->Makefile->GetSource(file);

  // for the location we must create a source file first
  if (!sf && args[2] == "LOCATION")
    {
    sf = this->Makefile->CreateSource(file);
    }
  if(sf)
    {
    if(args[2] == "LANGUAGE")
      {
      this->Makefile->AddDefinition(var, sf->GetLanguage().c_str());
      return true;
      }
    const char *prop = 0;
    if (!args[2].empty())
      {
      prop = sf->GetPropertyForUser(args[2]);
      }
    if (prop)
      {
      this->Makefile->AddDefinition(var, prop);
      return true;
      }
    }

  this->Makefile->AddDefinition(var, "NOTFOUND");
  return true;
}